

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_xop.cpp
# Opt level: O2

void ncnn::im2col_sgemm_int8_sse_xop(Mat *bottom_im2col,Mat *top_blob,Mat *kernel,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  int iVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  long lVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  undefined1 *puVar17;
  long lVar18;
  ulong uVar19;
  undefined1 (*pauVar20) [16];
  undefined1 (*pauVar21) [16];
  void *pvVar22;
  size_t _elemsize;
  ulong uVar23;
  uint uVar24;
  long lVar25;
  undefined4 *puVar26;
  void *pvVar27;
  undefined1 *puVar28;
  undefined4 *puVar29;
  undefined4 *puVar30;
  long lVar31;
  ulong uVar32;
  ulong *puVar33;
  long lVar34;
  undefined4 *puVar35;
  int *piVar36;
  bool bVar37;
  undefined1 auVar38 [16];
  undefined1 auVar39 [64];
  undefined1 auVar40 [16];
  undefined1 auVar41 [64];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 local_88 [64];
  size_t local_48;
  void *local_40;
  long local_38;
  
  uVar4 = bottom_im2col->w;
  iVar16 = bottom_im2col->h;
  uVar24 = bottom_im2col->c;
  lVar34 = (long)(int)uVar24;
  iVar5 = top_blob->c;
  local_48 = 0;
  local_88._0_8_ = (void *)0x0;
  local_88._8_4_ = 0;
  local_88._12_4_ = 0;
  local_88._16_8_ = 0;
  local_88._24_4_ = 0;
  local_88._32_8_ = (Allocator *)0x0;
  local_88._40_4_ = 0;
  local_88._44_4_ = 0;
  local_88._48_12_ = SUB1612((undefined1  [16])0x0,4);
  iVar10 = iVar16;
  uVar9 = uVar4;
  if (lVar34 < 4) {
    _elemsize = 1;
    iVar15 = 1;
    uVar11 = uVar24;
    if (1 < (int)uVar4) {
      iVar10 = iVar16 * 2;
      uVar9 = (uVar4 & 1) + (uVar4 >> 1);
    }
  }
  else {
    _elemsize = 4;
    if ((int)uVar4 < 2) {
      uVar11 = (uVar24 & 3) + (uVar24 >> 2);
    }
    else {
      uVar11 = (uVar24 & 3) + (uVar24 >> 2);
      iVar10 = iVar16 * 2;
      uVar9 = (uVar4 & 1) + (uVar4 >> 1);
    }
    iVar15 = 4;
  }
  Mat::create((Mat *)local_88,iVar10,uVar11,uVar9,_elemsize,iVar15,opt->workspace_allocator);
  uVar19 = 0;
  iVar10 = 0;
  if (0 < iVar16) {
    iVar10 = iVar16;
  }
  uVar23 = (ulong)(int)uVar4;
  uVar13 = (ulong)(uint)((int)uVar4 >> 1);
  if ((int)uVar4 >> 1 < 1) {
    uVar13 = uVar19;
  }
  lVar25 = 1;
  for (; uVar19 != uVar13; uVar19 = uVar19 + 1) {
    puVar28 = (undefined1 *)(local_48 * uVar19 * local_88._16_8_ + local_88._0_8_);
    lVar14 = 1;
    lVar31 = 2;
    lVar18 = 3;
    for (uVar32 = 0; (long)(uVar32 | 3) < lVar34; uVar32 = uVar32 + 4) {
      lVar8 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar12 = (long)bottom_im2col->data + lVar25;
      iVar15 = iVar10;
      while (bVar37 = iVar15 != 0, iVar15 = iVar15 + -1, bVar37) {
        *puVar28 = *(undefined1 *)(lVar12 + -1 + lVar8 * uVar32);
        puVar28[1] = *(undefined1 *)(lVar12 + -1 + lVar8 * lVar14);
        puVar28[2] = *(undefined1 *)(lVar12 + -1 + lVar8 * lVar31);
        puVar28[3] = *(undefined1 *)(lVar12 + -1 + lVar8 * lVar18);
        puVar28[4] = *(undefined1 *)(lVar12 + lVar8 * uVar32);
        puVar28[5] = *(undefined1 *)(lVar12 + lVar8 * lVar14);
        puVar28[6] = *(undefined1 *)(lVar12 + lVar8 * lVar31);
        puVar28[7] = *(undefined1 *)(lVar12 + lVar8 * lVar18);
        puVar28 = puVar28 + 8;
        lVar12 = lVar12 + uVar23;
      }
      lVar18 = lVar18 + 4;
      lVar31 = lVar31 + 4;
      lVar14 = lVar14 + 4;
    }
    for (; (long)uVar32 < lVar34; uVar32 = uVar32 + 1) {
      lVar14 = bottom_im2col->cstep * bottom_im2col->elemsize * uVar32;
      lVar31 = (long)bottom_im2col->data + lVar25;
      iVar15 = iVar10;
      while (bVar37 = iVar15 != 0, iVar15 = iVar15 + -1, bVar37) {
        *puVar28 = *(undefined1 *)(lVar31 + -1 + lVar14);
        puVar28[1] = *(undefined1 *)(lVar31 + lVar14);
        puVar28 = puVar28 + 2;
        lVar31 = lVar31 + uVar23;
      }
    }
    lVar25 = lVar25 + 2;
  }
  for (uVar19 = uVar23 & 0xfffffffffffffffe; (long)uVar19 < (long)uVar23; uVar19 = uVar19 + 1) {
    uVar13 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
    puVar28 = (undefined1 *)
              ((long)((int)((long)uVar13 % 2) + (int)((long)uVar13 / 2)) * local_48 *
               local_88._16_8_ + local_88._0_8_);
    lVar25 = 1;
    lVar14 = 2;
    lVar31 = 3;
    for (uVar13 = 0; (long)(uVar13 | 3) < lVar34; uVar13 = uVar13 + 4) {
      lVar18 = bottom_im2col->elemsize * bottom_im2col->cstep;
      lVar8 = (long)bottom_im2col->data + uVar19;
      iVar15 = iVar10;
      while (bVar37 = iVar15 != 0, iVar15 = iVar15 + -1, bVar37) {
        *puVar28 = *(undefined1 *)(lVar8 + lVar18 * uVar13);
        puVar28[1] = *(undefined1 *)(lVar8 + lVar18 * lVar25);
        puVar28[2] = *(undefined1 *)(lVar8 + lVar18 * lVar14);
        puVar28[3] = *(undefined1 *)(lVar8 + lVar18 * lVar31);
        puVar28 = puVar28 + 4;
        lVar8 = lVar8 + uVar23;
      }
      lVar31 = lVar31 + 4;
      lVar14 = lVar14 + 4;
      lVar25 = lVar25 + 4;
    }
    for (; (long)uVar13 < lVar34; uVar13 = uVar13 + 1) {
      puVar17 = (undefined1 *)
                ((long)bottom_im2col->data +
                uVar19 + bottom_im2col->cstep * uVar13 * bottom_im2col->elemsize);
      iVar15 = iVar10;
      while (bVar37 = iVar15 != 0, iVar15 = iVar15 + -1, bVar37) {
        *puVar28 = *puVar17;
        puVar28 = puVar28 + 1;
        puVar17 = puVar17 + uVar23;
      }
    }
  }
  pvVar27 = top_blob->data;
  lVar34 = top_blob->elemsize * top_blob->cstep;
  uVar9 = ((int)uVar24 / 4) * iVar16;
  iVar16 = ((int)uVar24 % 4) * iVar16;
  uVar19 = 0;
  if (iVar16 < 1) {
    iVar16 = 0;
  }
  uVar13 = (ulong)(uint)(iVar5 >> 2);
  if (iVar5 >> 2 < 1) {
    uVar13 = uVar19;
  }
  do {
    if (uVar19 == uVar13) {
      local_38 = top_blob->elemsize * top_blob->cstep;
      local_40 = top_blob->data;
      for (uVar19 = (long)iVar5 & 0xfffffffffffffffc; (long)uVar19 < (long)iVar5;
          uVar19 = uVar19 + 1) {
        uVar13 = (ulong)(uint)((int)uVar19 >> 0x1f) << 0x20 | uVar19 & 0xffffffff;
        piVar36 = (int *)(local_38 * uVar19 + (long)local_40);
        lVar34 = (long)((int)((long)uVar13 % 4) + (int)((long)uVar13 / 4));
        pvVar27 = (void *)(kernel->cstep * lVar34 * kernel->elemsize + (long)kernel->data);
        for (uVar13 = 0; (long)(uVar13 | 1) < (long)uVar23; uVar13 = uVar13 + 2) {
          puVar33 = (ulong *)((uVar13 >> 1) * local_88._16_8_ * local_48 + local_88._0_8_);
          if ((int)uVar9 < 1) {
            iVar10 = 0;
            iVar15 = 0;
            pvVar22 = pvVar27;
          }
          else {
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            lVar25 = 0;
            auVar41 = ZEXT1664((undefined1  [16])0x0);
            while( true ) {
              auVar38 = auVar39._0_16_;
              auVar40 = auVar41._0_16_;
              if (uVar9 == (uint)lVar25) break;
              auVar43._8_8_ = 0;
              auVar43._0_8_ = *puVar33;
              auVar42 = vpcmpgtb_avx((undefined1  [16])0x0,auVar43);
              auVar1 = vpunpcklbw_avx(auVar43,auVar42);
              auVar42._8_8_ = 0;
              auVar42._0_8_ = *(ulong *)((long)pvVar27 + lVar25 * 4);
              auVar42 = vpmovsxbw_avx(auVar42);
              auVar42 = vpshufd_avx(auVar42,0x44);
              auVar43 = vpmullw_avx(auVar42,auVar1);
              auVar42 = vpmulhw_avx(auVar1,auVar42);
              auVar1 = vpunpcklwd_avx(auVar43,auVar42);
              auVar38 = vpaddd_avx(auVar38,auVar1);
              auVar39 = ZEXT1664(auVar38);
              auVar38 = vpunpckhwd_avx(auVar43,auVar42);
              auVar38 = vpaddd_avx(auVar40,auVar38);
              auVar41 = ZEXT1664(auVar38);
              puVar33 = puVar33 + 1;
              lVar25 = lVar25 + 1;
            }
            auVar38 = vphaddd_avx(auVar38,auVar38);
            auVar38 = vphaddd_avx(auVar38,auVar38);
            auVar40 = vphaddd_avx(auVar40,auVar40);
            auVar40 = vphaddd_avx(auVar40,auVar40);
            iVar10 = auVar38._0_4_;
            iVar15 = auVar40._0_4_;
            pvVar22 = (void *)((ulong)uVar9 * 4 + (long)pvVar27);
          }
          for (lVar25 = 0; iVar16 != (int)lVar25; lVar25 = lVar25 + 1) {
            iVar10 = iVar10 + (int)*(char *)((long)puVar33 + lVar25 * 2) *
                              (int)*(char *)((long)pvVar22 + lVar25);
            iVar15 = iVar15 + (int)*(char *)((long)puVar33 + lVar25 * 2 + 1) *
                              (int)*(char *)((long)pvVar22 + lVar25);
          }
          *piVar36 = iVar10;
          piVar36[1] = iVar15;
          piVar36 = piVar36 + 2;
        }
        pvVar27 = (void *)(lVar34 * kernel->cstep * kernel->elemsize + (long)kernel->data);
        while (uVar24 = (uint)uVar13, (int)uVar24 < (int)uVar4) {
          puVar33 = (ulong *)((ulong)((uVar24 & 1) + ((uint)(uVar13 >> 1) & 0x7fffffff)) *
                              local_88._16_8_ * local_48 + local_88._0_8_);
          if ((int)uVar9 < 1) {
            iVar10 = 0;
            pvVar22 = pvVar27;
          }
          else {
            auVar39 = ZEXT1664((undefined1  [16])0x0);
            for (lVar34 = 0; auVar38 = auVar39._0_16_, uVar9 != (uint)lVar34; lVar34 = lVar34 + 1) {
              auVar40._8_8_ = 0;
              auVar40._0_8_ = *puVar33;
              auVar40 = vpmovsxbw_avx(auVar40);
              auVar1._8_8_ = 0;
              auVar1._0_8_ = *(ulong *)((long)pvVar27 + lVar34 * 4);
              auVar42 = vpmovsxbw_avx(auVar1);
              auVar43 = vpmullw_avx(auVar42,auVar40);
              auVar40 = vpmulhw_avx(auVar40,auVar42);
              auVar40 = vpunpcklwd_avx(auVar43,auVar40);
              auVar38 = vpaddd_avx(auVar38,auVar40);
              auVar39 = ZEXT1664(auVar38);
              puVar33 = (ulong *)((long)puVar33 + 4);
            }
            auVar38 = vphaddd_avx(auVar38,auVar38);
            auVar38 = vphaddd_avx(auVar38,auVar38);
            iVar10 = auVar38._0_4_;
            pvVar22 = (void *)((long)pvVar27 + (ulong)uVar9 * 4);
          }
          for (lVar34 = 0; iVar16 != (int)lVar34; lVar34 = lVar34 + 1) {
            iVar10 = iVar10 + (int)*(char *)((long)pvVar22 + lVar34) *
                              (int)*(char *)((long)puVar33 + lVar34);
          }
          *piVar36 = iVar10;
          piVar36 = piVar36 + 1;
          uVar13 = (ulong)(uVar24 + 1);
        }
      }
      piVar36 = (int *)CONCAT44(local_88._12_4_,local_88._8_4_);
      if (piVar36 != (int *)0x0) {
        LOCK();
        *piVar36 = *piVar36 + -1;
        UNLOCK();
        if (*piVar36 == 0) {
          if ((Allocator *)local_88._32_8_ == (Allocator *)0x0) {
            free((void *)local_88._0_8_);
          }
          else {
            (*(*(_func_int ***)local_88._32_8_)[3])();
          }
        }
      }
      return;
    }
    puVar26 = (undefined4 *)(uVar19 * 4 * lVar34 + (long)pvVar27);
    puVar29 = (undefined4 *)((uVar19 * 4 + 1) * lVar34 + (long)pvVar27);
    puVar35 = (undefined4 *)((uVar19 * 4 + 2) * lVar34 + (long)pvVar27);
    puVar30 = (undefined4 *)((uVar19 * 4 + 3) * lVar34 + (long)pvVar27);
    pauVar20 = (undefined1 (*) [16])(kernel->cstep * uVar19 * kernel->elemsize + (long)kernel->data)
    ;
    for (uVar32 = 0; (long)(uVar32 | 1) < (long)uVar23; uVar32 = uVar32 + 2) {
      puVar33 = (ulong *)((uVar32 >> 1) * local_88._16_8_ * local_48 + local_88._0_8_);
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      auVar41 = ZEXT1664((undefined1  [16])0x0);
      if (0 < (int)uVar9) {
        if (uVar9 != 0) {
          auVar38._8_8_ = 0;
          auVar38._0_8_ = *puVar33;
          auVar42 = vpmovsxbw_avx(auVar38);
          auVar38 = *pauVar20;
          auVar40 = vpcmpgtb_avx((undefined1  [16])0x0,auVar38);
          vpunpcklbw_avx(auVar38,auVar40);
          vpunpckhbw_avx(auVar38,auVar40);
          vpshufd_avx(auVar42,0x44);
          halt_baddata();
        }
        auVar38 = vphaddd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar41 = ZEXT1664(auVar38);
        auVar38 = vphaddd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
        auVar39 = ZEXT1664(auVar38);
      }
      lVar25 = 0;
      while( true ) {
        if (iVar16 == (int)lVar25) break;
        auVar38 = vpmovsxbw_avx(ZEXT216(*(ushort *)((long)puVar33 + lVar25 * 2)));
        auVar38 = vpshuflw_avx(auVar38,0x50);
        auVar40 = vpshufd_avx(auVar38,0x50);
        auVar2._8_8_ = 0;
        auVar2._0_8_ = *(ulong *)(*pauVar20 + lVar25 * 4);
        auVar38 = vpmovsxbw_avx(auVar2);
        auVar38 = vpshufd_avx(auVar38,0x44);
        auVar42 = vpmullw_avx(auVar40,auVar38);
        auVar40 = vpmulhw_avx(auVar40,auVar38);
        auVar38 = vpunpcklwd_avx(auVar42,auVar40);
        auVar38 = vpaddd_avx(auVar41._0_16_,auVar38);
        auVar41 = ZEXT1664(auVar38);
        auVar38 = vpunpckhwd_avx(auVar42,auVar40);
        auVar38 = vpaddd_avx(auVar39._0_16_,auVar38);
        auVar39 = ZEXT1664(auVar38);
        lVar25 = lVar25 + 1;
      }
      *puVar26 = auVar41._0_4_;
      *puVar29 = auVar41._4_4_;
      *puVar35 = auVar41._8_4_;
      *puVar30 = auVar41._12_4_;
      puVar26[1] = auVar39._0_4_;
      puVar29[1] = auVar39._4_4_;
      puVar35[1] = auVar39._8_4_;
      puVar30[1] = auVar39._12_4_;
      puVar26 = puVar26 + 2;
      puVar29 = puVar29 + 2;
      puVar35 = puVar35 + 2;
      puVar30 = puVar30 + 2;
    }
    pauVar20 = (undefined1 (*) [16])(kernel->cstep * uVar19 * kernel->elemsize + (long)kernel->data)
    ;
    while (uVar24 = (uint)uVar32, (int)uVar24 < (int)uVar4) {
      puVar33 = (ulong *)((ulong)((uVar24 & 1) + ((uint)(uVar32 >> 1) & 0x7fffffff)) *
                          local_88._16_8_ * local_48 + local_88._0_8_);
      auVar39 = ZEXT1664((undefined1  [16])0x0);
      pauVar21 = pauVar20;
      if (0 < (int)uVar9) {
        auVar41 = ZEXT1664((undefined1  [16])0x0);
        auVar44 = ZEXT1664((undefined1  [16])0x0);
        auVar45 = ZEXT1664((undefined1  [16])0x0);
        uVar11 = uVar9;
        while( true ) {
          bVar37 = uVar11 == 0;
          uVar11 = uVar11 - 1;
          auVar38 = auVar39._0_16_;
          auVar40 = auVar41._0_16_;
          auVar42 = auVar44._0_16_;
          auVar43 = auVar45._0_16_;
          if (bVar37) break;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *puVar33;
          auVar3 = vpmovsxbw_avx(auVar3);
          auVar1 = *pauVar21;
          auVar2 = vpcmpgtb_avx((undefined1  [16])0x0,auVar1);
          auVar7 = vpunpcklbw_avx(auVar1,auVar2);
          auVar6 = vpunpckhbw_avx(auVar1,auVar2);
          auVar2 = vpshufd_avx(auVar3,0x44);
          auVar3 = vpmullw_avx(auVar7,auVar2);
          auVar1 = vpmulhw_avx(auVar7,auVar2);
          auVar7 = vpmullw_avx(auVar2,auVar6);
          auVar2 = vpmulhw_avx(auVar2,auVar6);
          auVar6 = vpunpcklwd_avx(auVar3,auVar1);
          auVar38 = vpaddd_avx(auVar38,auVar6);
          auVar39 = ZEXT1664(auVar38);
          auVar38 = vpunpckhwd_avx(auVar3,auVar1);
          auVar38 = vpaddd_avx(auVar40,auVar38);
          auVar41 = ZEXT1664(auVar38);
          auVar38 = vpunpcklwd_avx(auVar7,auVar2);
          auVar38 = vpaddd_avx(auVar42,auVar38);
          auVar44 = ZEXT1664(auVar38);
          auVar38 = vpunpckhwd_avx(auVar7,auVar2);
          auVar38 = vpaddd_avx(auVar43,auVar38);
          auVar45 = ZEXT1664(auVar38);
          puVar33 = (ulong *)((long)puVar33 + 4);
          pauVar21 = pauVar21 + 1;
        }
        auVar1 = vpunpckldq_avx(auVar38,auVar40);
        auVar2 = vpunpckldq_avx(auVar42,auVar43);
        auVar40 = vpunpckhdq_avx(auVar38,auVar40);
        auVar42 = vpunpckhdq_avx(auVar42,auVar43);
        auVar43 = vpunpcklqdq_avx(auVar1,auVar2);
        auVar38 = vpunpckhqdq_avx(auVar1,auVar2);
        auVar38 = vpaddd_avx(auVar43,auVar38);
        auVar43 = vpunpcklqdq_avx(auVar40,auVar42);
        auVar40 = vpunpckhqdq_avx(auVar40,auVar42);
        auVar40 = vpaddd_avx(auVar40,auVar43);
        auVar38 = vpaddd_avx(auVar38,auVar40);
        auVar39 = ZEXT1664(auVar38);
      }
      for (lVar25 = 0; iVar16 != (int)lVar25; lVar25 = lVar25 + 1) {
        auVar38 = vpshuflw_avx(ZEXT416((uint)(int)*(char *)((long)puVar33 + lVar25)),0);
        auVar42 = vpshufd_avx(auVar38,0);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = *(ulong *)(*pauVar21 + lVar25 * 4);
        auVar38 = vpmovsxbw_avx(auVar7);
        auVar40 = vpmullw_avx(auVar42,auVar38);
        auVar38 = vpmulhw_avx(auVar42,auVar38);
        auVar38 = vpunpcklwd_avx(auVar40,auVar38);
        auVar38 = vpaddd_avx(auVar39._0_16_,auVar38);
        auVar39 = ZEXT1664(auVar38);
      }
      *puVar26 = auVar39._0_4_;
      *puVar29 = auVar39._4_4_;
      *puVar35 = auVar39._8_4_;
      *puVar30 = auVar39._12_4_;
      puVar26 = puVar26 + 1;
      puVar29 = puVar29 + 1;
      puVar35 = puVar35 + 1;
      puVar30 = puVar30 + 1;
      uVar32 = (ulong)(uVar24 + 1);
    }
    uVar19 = uVar19 + 1;
  } while( true );
}

Assistant:

void im2col_sgemm_int8_sse_xop(const Mat& bottom_im2col, Mat& top_blob, const Mat& kernel, const Option& opt)
{
    im2col_sgemm_int8_sse(bottom_im2col, top_blob, kernel, opt);
}